

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O2

bool __thiscall ON_Sphere::Transform(ON_Sphere *this,ON_Xform *xform)

{
  bool bVar1;
  long lVar2;
  ON_Circle *pOVar3;
  ON_Sphere *pOVar4;
  byte bVar5;
  ON_Circle xc;
  
  bVar5 = 0;
  ON_Circle::ON_Circle(&xc,&this->plane,this->radius);
  bVar1 = ON_Circle::Transform(&xc,xform);
  if (bVar1) {
    pOVar3 = &xc;
    pOVar4 = this;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar4->plane).origin.x = *(double *)pOVar3;
      pOVar3 = (ON_Circle *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pOVar4 = (ON_Sphere *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    this->radius = xc.radius;
  }
  ON_Plane::~ON_Plane(&xc.plane);
  return bVar1;
}

Assistant:

bool ON_Sphere::Transform( const ON_Xform& xform )
{
  ON_Circle xc(plane,radius);
  bool rc = xc.Transform(xform);
  if (rc)
  {
    plane = xc.plane;
    radius = xc.radius;
  }
  return rc;
}